

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

void __thiscall HighsSymmetryDetection::removeFixPoints(HighsSymmetryDetection *this)

{
  uint uVar1;
  pointer ppVar2;
  pointer piVar3;
  pointer piVar4;
  HighsInt HVar5;
  ulong in_RAX;
  int *piVar6;
  int *piVar7;
  pointer piVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  pointer ppVar12;
  ulong uVar13;
  int *piVar14;
  uint *puVar15;
  pointer piVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  pointer ppVar21;
  pointer ppVar22;
  long lVar23;
  int __tmp;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::vector<int,_std::allocator<int>_>::resize(&this->Gend,(long)this->numVertices);
  uVar13 = (ulong)(uint)this->numVertices;
  if (0 < this->numVertices) {
    ppVar2 = (this->Gedge).
             super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar16 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar19 = 0;
    do {
      iVar18 = piVar16[lVar19];
      ppVar12 = ppVar2 + iVar18;
      iVar11 = piVar16[lVar19 + 1];
      if (iVar18 != iVar11) {
        ppVar21 = ppVar2 + iVar11;
        ppVar22 = ppVar12;
        do {
          while (ppVar12 = ppVar22, iVar18 = ppVar12->first, iVar11 = piVar3[iVar18],
                piVar4[iVar11] - iVar11 < 2) {
            do {
              ppVar22 = ppVar21;
              ppVar21 = ppVar22 + -1;
              if (ppVar21 == ppVar12) goto LAB_002fd2f2;
              iVar11 = piVar3[ppVar21->first];
            } while (piVar4[iVar11] - iVar11 < 2);
            ppVar12->first = ppVar21->first;
            ppVar21->first = iVar18;
            uVar10 = ppVar12->second;
            ppVar12->second = ppVar22[-1].second;
            ppVar22[-1].second = uVar10;
            ppVar22 = ppVar12 + 1;
            if (ppVar21 == ppVar12 + 1) {
              ppVar12 = ppVar12 + 1;
              goto LAB_002fd2f2;
            }
          }
          ppVar12 = ppVar12 + 1;
          ppVar22 = ppVar12;
        } while (ppVar12 != ppVar21);
      }
LAB_002fd2f2:
      piVar8[lVar19] = (int)((ulong)((long)ppVar12 - (long)ppVar2) >> 3);
      lVar19 = lVar19 + 1;
      uVar13 = (ulong)this->numVertices;
    } while (lVar19 < (long)uVar13);
  }
  piVar6 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar19 = (long)piVar9 - (long)piVar6 >> 4;
  piVar14 = piVar6;
  if (0 < lVar19) {
    piVar16 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar14 = (int *)(((long)piVar9 - (long)piVar6 & 0xfffffffffffffff0U) + (long)piVar6);
    lVar19 = lVar19 + 1;
    piVar6 = piVar6 + 2;
    do {
      if (piVar16[piVar8[piVar6[-2]]] - piVar8[piVar6[-2]] == 1) {
        puVar15 = (uint *)(piVar8 + piVar6[-2]);
        piVar6 = piVar6 + -2;
        goto LAB_002fd4cc;
      }
      lVar23 = (long)piVar6[-1];
      if (piVar16[piVar8[lVar23]] - piVar8[lVar23] == 1) {
        piVar6 = piVar6 + -1;
LAB_002fd4c8:
        puVar15 = (uint *)(piVar8 + lVar23);
        goto LAB_002fd4cc;
      }
      lVar23 = (long)*piVar6;
      if (piVar16[piVar8[lVar23]] - piVar8[lVar23] == 1) goto LAB_002fd4c8;
      lVar23 = (long)piVar6[1];
      if (piVar16[piVar8[lVar23]] - piVar8[lVar23] == 1) {
        piVar6 = piVar6 + 1;
        goto LAB_002fd4c8;
      }
      lVar19 = lVar19 + -1;
      piVar6 = piVar6 + 4;
    } while (1 < lVar19);
  }
  lVar19 = (long)piVar9 - (long)piVar14 >> 2;
  piVar7 = piVar9;
  if (lVar19 == 1) {
LAB_002fd487:
    lVar19 = (long)*piVar14;
    piVar16 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar6 = piVar14;
    if ((this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[piVar16[lVar19]] - piVar16[lVar19] != 1) goto LAB_002fd4d0;
  }
  else if (lVar19 == 2) {
LAB_002fd461:
    lVar19 = (long)*piVar14;
    piVar16 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar6 = piVar14;
    if ((this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[piVar16[lVar19]] - piVar16[lVar19] != 1) {
      piVar14 = piVar14 + 1;
      goto LAB_002fd487;
    }
  }
  else {
    if (lVar19 != 3) goto LAB_002fd4d0;
    lVar19 = (long)*piVar14;
    piVar16 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar6 = piVar14;
    if ((this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[piVar16[lVar19]] - piVar16[lVar19] != 1) {
      piVar14 = piVar14 + 1;
      goto LAB_002fd461;
    }
  }
  puVar15 = (uint *)(piVar16 + lVar19);
LAB_002fd4cc:
  uVar10 = (int)uVar13 - 1;
  uVar13 = (ulong)uVar10;
  *puVar15 = uVar10;
  piVar7 = piVar6;
LAB_002fd4d0:
  if ((piVar7 != piVar9) && (piVar6 = piVar7 + 1, piVar6 != piVar9)) {
    piVar16 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar18 = *piVar6;
      iVar11 = piVar8[iVar18];
      if (piVar16[iVar11] - iVar11 == 1) {
        uVar10 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar10;
        piVar8[iVar18] = uVar10;
      }
      else {
        *piVar7 = iVar18;
        piVar7 = piVar7 + 1;
      }
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar9);
  }
  if ((piVar7 != piVar9) &&
     (piVar16 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,
     piVar8 = (pointer)((long)piVar7 + ((long)piVar16 - (long)piVar9)), piVar16 != piVar8)) {
    (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar8;
  }
  iVar18 = this->numVertices;
  if (0 < (long)iVar18) {
    piVar16 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar2 = (this->Gedge).
             super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar19 = 0;
    do {
      iVar11 = piVar8[lVar19];
      lVar20 = (long)iVar11;
      lVar23 = lVar19 + 1;
      if ((iVar11 != piVar16[lVar19 + 1]) && (iVar11 < piVar16[lVar23])) {
        do {
          ppVar2[lVar20].first = piVar3[ppVar2[lVar20].first];
          lVar20 = lVar20 + 1;
        } while (lVar20 < piVar16[lVar23]);
      }
      lVar19 = lVar23;
    } while (lVar23 != iVar18);
  }
  iVar11 = (int)((ulong)((long)(this->currentPartition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2);
  if (iVar11 < iVar18) {
    this->numVertices = iVar11;
    if (iVar11 == 0) {
      HVar5 = 0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::resize(&this->currentPartitionLinks,(long)iVar11);
      uStack_28 = uStack_28 & 0xffffffffffffff;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
                (&this->cellInRefinementQueue,(long)this->numVertices,
                 (value_type_conflict5 *)((long)&uStack_28 + 7));
      piVar16 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar16) {
        (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar16;
      }
      iVar18 = this->numVertices;
      uVar13 = 0;
      if (0 < iVar18) {
        piVar16 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar8 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        piVar3 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = 0;
        uVar10 = 0;
        do {
          uVar1 = piVar3[piVar16[uVar17]];
          if ((uint)uVar13 != uVar1) {
            lVar19 = (long)(int)uVar10;
            uVar10 = (uint)uVar17;
            piVar8[lVar19] = uVar10;
            uVar13 = (ulong)uVar1;
          }
          iVar18 = piVar16[uVar17];
          if ((piVar3[iVar18] != uVar10) && (piVar3[iVar18] = uVar10, uVar17 != uVar10)) {
            piVar8[uVar17] = uVar10;
          }
          uVar17 = uVar17 + 1;
          iVar18 = this->numVertices;
        } while ((long)uVar17 < (long)iVar18);
        uVar13 = (ulong)(int)uVar10;
      }
      (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] = iVar18;
      piVar6 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = (long)(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
      piVar9 = piVar6;
      if (0 < (long)uVar13) {
        do {
          uVar17 = uVar13 >> 1;
          uVar13 = ~uVar17 + uVar13;
          piVar14 = piVar9 + uVar17 + 1;
          if (this->numCol <= piVar9[uVar17]) {
            uVar13 = uVar17;
            piVar14 = piVar9;
          }
          piVar9 = piVar14;
        } while (0 < (long)uVar13);
      }
      HVar5 = (HighsInt)((ulong)((long)piVar9 - (long)piVar6) >> 2);
    }
  }
  else {
    HVar5 = this->numCol;
  }
  this->numActiveCols = HVar5;
  return;
}

Assistant:

void HighsSymmetryDetection::removeFixPoints() {
  Gend.resize(numVertices);
  for (HighsInt i = 0; i < numVertices; ++i) {
    Gend[i] =
        std::partition(Gedge.begin() + Gstart[i], Gedge.begin() + Gstart[i + 1],
                       [&](const std::pair<HighsInt, HighsUInt>& edge) {
                         return cellSize(vertexToCell[edge.first]) > 1;
                       }) -
        Gedge.begin();
    assert(Gend[i] >= Gstart[i] && Gend[i] <= Gstart[i + 1]);
  }

  HighsInt unitCellIndex = numVertices;
  currentPartition.erase(
      std::remove_if(currentPartition.begin(), currentPartition.end(),
                     [&](HighsInt vertex) {
                       if (cellSize(vertexToCell[vertex]) == 1) {
                         --unitCellIndex;
                         vertexToCell[vertex] = unitCellIndex;
                         return true;
                       }
                       return false;
                     }),
      currentPartition.end());

  for (HighsInt i = 0; i < numVertices; ++i) {
    if (Gend[i] == Gstart[i + 1]) continue;

    for (HighsInt j = Gend[i]; j < Gstart[i + 1]; ++j)
      Gedge[j].first = vertexToCell[Gedge[j].first];
  }

  if ((HighsInt)currentPartition.size() < numVertices) {
    numVertices = currentPartition.size();
    if (numVertices == 0) {
      numActiveCols = 0;
      return;
    }
    currentPartitionLinks.resize(numVertices);
    cellInRefinementQueue.assign(numVertices, false);
    assert(refinementQueue.empty());
    refinementQueue.clear();
    HighsInt cellStart = 0;
    HighsInt cellNumber = 0;
    for (HighsInt i = 0; i < numVertices; ++i) {
      HighsInt vertex = currentPartition[i];
      // if the cell number is different to the current cell number this is the
      // start of a new cell
      if (cellNumber != vertexToCell[vertex]) {
        // remember the number of this cell to identify its end
        cellNumber = vertexToCell[vertex];
        // set the link of the cell start to point to its end
        currentPartitionLinks[cellStart] = i;
        // remember start of this cell
        cellStart = i;
      }

      // correct the vertexToCell array to store the start index of the
      // cell, not its number
      updateCellMembership(i, cellStart, false);
    }

    // set the column partition link of the last started cell to point past the
    // end
    assert((int)currentPartitionLinks.size() > 0);
    currentPartitionLinks[cellStart] = numVertices;

    numActiveCols =
        std::partition_point(currentPartition.begin(), currentPartition.end(),
                             [&](HighsInt v) { return v < numCol; }) -
        currentPartition.begin();
  } else
    numActiveCols = numCol;
}